

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnderwaterAcousticFundamentalParameterData.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::UnderwaterAcousticFundamentalParameterData::Encode
          (UnderwaterAcousticFundamentalParameterData *this,KDataStream *stream)

{
  KDataStream::Write<unsigned_short>(stream,this->m_ui16AEPI);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16ScanPattern);
  KDataStream::Write<float>(stream,(float)this->m_f32BeamCenterAzimuth);
  KDataStream::Write<float>(stream,(float)this->m_f32AzimuthalBeamWidth);
  KDataStream::Write<float>(stream,(float)this->m_f32BeamCenterDE);
  KDataStream::Write<float>(stream,(float)this->m_f32DEBeamwidth);
  return;
}

Assistant:

void UnderwaterAcousticFundamentalParameterData::Encode( KDataStream & stream ) const
{
    stream << m_ui16AEPI
           << m_ui16ScanPattern
           << m_f32BeamCenterAzimuth
           << m_f32AzimuthalBeamWidth
           << m_f32BeamCenterDE
           << m_f32DEBeamwidth;
}